

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O1

uint64_t __thiscall fast_float::bigint::hi64(bigint *this,bool *truncated)

{
  ushort uVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  uVar1 = (this->vec).length;
  uVar7 = (ulong)uVar1;
  if (uVar1 == 1) {
    uVar5 = (this->vec).data[uVar7 - 1];
    *truncated = false;
    if (uVar5 == 0) {
LAB_003a0bdb:
      __assert_fail("input_num > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/fast_float/include/fast_float/float_common.h"
                    ,0xeb,"int fast_float::leading_zeroes(uint64_t)");
    }
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar5 = uVar5 << (~(byte)lVar3 & 0x3f);
  }
  else if (uVar1 == 0) {
    *truncated = false;
    uVar5 = 0;
  }
  else {
    uVar5 = (this->vec).data[uVar7 - 1];
    if (uVar5 == 0) goto LAB_003a0bdb;
    uVar2 = (this->vec).data[uVar7 - 2];
    uVar4 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    if ((uVar4 ^ 0x3f) == 0) {
      *truncated = uVar2 != 0;
    }
    else {
      bVar6 = (byte)(uVar4 ^ 0x3f);
      *truncated = uVar2 << (bVar6 & 0x3f) != 0;
      bVar6 = bVar6 & 0x3f;
      uVar5 = uVar5 << bVar6 | uVar2 >> 0x40 - bVar6;
    }
    bVar9 = 2 < uVar1;
    if ((bVar9) && ((this->vec).data[uVar7 - 3] == 0)) {
      lVar3 = 0;
      do {
        lVar8 = lVar3;
        if (3 - uVar7 == lVar8) break;
        lVar3 = lVar8 + -1;
      } while ((this->vec).data[uVar7 + lVar8 + -4] == 0);
      bVar9 = 3U - lVar8 < uVar7;
    }
    *truncated = (bool)(*truncated | bVar9);
  }
  return uVar5;
}

Assistant:

FASTFLOAT_CONSTEXPR20 uint64_t hi64(bool& truncated) const noexcept {
#ifdef FASTFLOAT_64BIT_LIMB
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint64_hi64(vec.rindex(0), truncated);
    } else {
      uint64_t result = uint64_hi64(vec.rindex(0), vec.rindex(1), truncated);
      truncated |= vec.nonzero(2);
      return result;
    }
#else
    if (vec.len() == 0) {
      return empty_hi64(truncated);
    } else if (vec.len() == 1) {
      return uint32_hi64(vec.rindex(0), truncated);
    } else if (vec.len() == 2) {
      return uint32_hi64(vec.rindex(0), vec.rindex(1), truncated);
    } else {
      uint64_t result = uint32_hi64(vec.rindex(0), vec.rindex(1), vec.rindex(2), truncated);
      truncated |= vec.nonzero(3);
      return result;
    }
#endif
  }